

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  Layer *pLVar2;
  int *piVar3;
  bool bVar4;
  ulong uVar5;
  Layer *pLVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong local_5f0;
  ParamDict pd;
  
  uVar8 = (ulong)((long)(this->super_Net).layers.
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->super_Net).layers.
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar7 = (int)uVar8;
  uVar5 = 0;
  if (0 < iVar7) {
    uVar5 = uVar8 & 0xffffffff;
  }
  local_5f0 = 1;
  uVar8 = 0;
  do {
    if (uVar8 == uVar5) {
      return 0;
    }
    bVar4 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar8]->type,"Pooling");
    if ((!bVar4) &&
       (pLVar6 = (this->super_Net).layers.
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8],
       *(int *)((long)&pLVar6[1].type.field_2 + 4) != 0)) {
      iVar1 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar9 = local_5f0; (int)uVar9 < iVar7; uVar9 = uVar9 + 1) {
        bVar4 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"Convolution"
                               );
        if (((!bVar4) &&
            (pLVar2 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9],
            piVar3 = (pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3 == 4)) && (*piVar3 == iVar1)) {
          if ((int)uVar9 != iVar7) {
            pLVar2 = (this->super_Net).layers.
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9 & 0xffffffff];
            fprintf(_stderr,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",
                    (pLVar6->name)._M_dataplus._M_p,(pLVar2->name)._M_dataplus._M_p);
            pLVar6 = ncnn::create_layer("InnerProduct");
            std::__cxx11::string::assign((char *)&pLVar6->type);
            std::__cxx11::string::_M_assign((string *)&pLVar6->name);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar6->bottoms,&pLVar2->bottoms);
            std::vector<int,_std::allocator<int>_>::operator=(&pLVar6->tops,&pLVar2->tops);
            ncnn::ParamDict::ParamDict(&pd);
            (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
            *(undefined4 *)&pLVar6[1]._vptr_Layer = *(undefined4 *)&pLVar2[1]._vptr_Layer;
            *(undefined8 *)((long)&pLVar6[1]._vptr_Layer + 4) =
                 *(undefined8 *)((long)&pLVar2[1].type.field_2 + 4);
            ncnn::Mat::operator=
                      ((Mat *)&pLVar6[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                       (Mat *)&pLVar2[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
            ncnn::Mat::operator=
                      ((Mat *)&pLVar6[2].type._M_string_length,
                       (Mat *)&pLVar2[2].name._M_string_length);
            *(undefined4 *)&pLVar6[1].type._M_dataplus._M_p =
                 *(undefined4 *)&pLVar2[1].name._M_dataplus._M_p;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar6[1].type._M_string_length,
                       (Mat *)&pLVar2[1].name._M_string_length);
            (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9 & 0xffffffff] = pLVar6;
            (*pLVar2->_vptr_Layer[1])(pLVar2);
            ncnn::ParamDict::~ParamDict(&pd);
          }
          break;
        }
      }
    }
    uVar8 = uVar8 + 1;
    local_5f0 = local_5f0 + 1;
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}